

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigFilter.cpp
# Opt level: O2

FilterList * __thiscall eglu::FilterList::operator<<(FilterList *this,FilterList *other)

{
  pointer __src;
  size_t __n;
  long lVar1;
  
  lVar1 = (long)(this->m_rules).
                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_rules).
                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::resize(&this->m_rules,
           ((long)(other->m_rules).
                  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(other->m_rules).
                  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) + (lVar1 >> 3));
  __src = (other->m_rules).
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(other->m_rules).
              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove((void *)(lVar1 + (long)(this->m_rules).
                                   super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                   ._M_impl.super__Vector_impl_data._M_start),__src,__n);
  }
  return this;
}

Assistant:

FilterList& FilterList::operator<< (const FilterList& other)
{
	size_t oldEnd = m_rules.size();
	m_rules.resize(m_rules.size()+other.m_rules.size());
	std::copy(other.m_rules.begin(), other.m_rules.end(), m_rules.begin()+oldEnd);
	return *this;
}